

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-utils.cc
# Opt level: O2

File __thiscall mp::NLUtils::openf(NLUtils *this,string *fname,int Close,char *mode)

{
  char cVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  char *in_R8;
  long lStack_20;
  
  this->_vptr_NLUtils = (_func_int **)0x0;
  pcVar2 = *(char **)CONCAT44(in_register_00000014,Close);
  if ((int)mode == 0) {
    File::Open((File *)this,pcVar2,in_R8);
    if (this->_vptr_NLUtils == (_func_int **)0x0) {
      pcVar2 = "can\'t open %s";
      lStack_20 = 0x20;
    }
    else {
      cVar1 = (**(code **)((fname->_M_dataplus)._M_p + 0x28))(fname);
      if (cVar1 == '\0') {
        return (File)(FILE *)this;
      }
      pcVar2 = "File %s\n";
      lStack_20 = 0x18;
    }
    (**(code **)((fname->_M_dataplus)._M_p + lStack_20))
              (fname,pcVar2,*(undefined8 *)CONCAT44(in_register_00000014,Close));
  }
  else {
    remove(pcVar2);
  }
  return (File)(FILE *)this;
}

Assistant:

File NLUtils::
openf(const std::string& fname, int Close, const char *mode)
{
  File f;
  if (Close) {
    std::remove(fname.c_str());
    return f;
  }
  f.Open(fname.c_str(), mode);
  if (!f) {
    log_warning("can't open %s", fname.c_str());
    return f;
  }
  if (if_show_filenames())
    log_message("File %s\n", fname.c_str());
  return f;
}